

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

char * lyd_get_unique_default(char *unique_expr,lyd_node *list)

{
  lys_node **pplVar1;
  long lVar2;
  lys_node *plVar3;
  int iVar4;
  uint uVar5;
  lys_iffeature *plVar6;
  lyd_node *set;
  ly_set *set_00;
  LY_ERR *pLVar7;
  uint uVar8;
  lys_node *plVar9;
  lys_node *plVar10;
  uint uVar11;
  ulong uVar12;
  lys_module *local_48;
  lyd_node *node;
  lys_node *local_38;
  
  if (unique_expr == (char *)0x0) {
    __assert_fail("unique_expr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x1366,"const char *lyd_get_unique_default(const char *, struct lyd_node *)");
  }
  iVar4 = resolve_descendant_schema_nodeid(unique_expr,list->schema->child,4,1,1,&local_38);
  plVar3 = local_38;
  if (iVar4 == 0 && local_38 != (lys_node *)0x0) {
    plVar9 = local_38[1].prev;
    if (plVar9 == (lys_node *)0x0) {
      if (((local_38->flags & 0x40) == 0) &&
         (plVar6 = local_38[1].iffeature, plVar6 != (lys_iffeature *)0x0)) {
        do {
          plVar9 = (lys_node *)plVar6[3].ext;
          plVar6 = (lys_iffeature *)plVar6[2].features;
          if (plVar6 == (lys_iffeature *)0x0) break;
        } while (plVar9 == (lys_node *)0x0);
      }
      else {
        plVar9 = (lys_node *)0x0;
      }
    }
    if (plVar9 == (lys_node *)0x0) {
      plVar9 = (lys_node *)0x0;
    }
    else {
      set = (lyd_node *)calloc(1,0x10);
      plVar10 = plVar3;
      while (local_38 = lys_parent(plVar10), local_38 != list->schema) {
        if ((local_38->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE|LYS_CONTAINER)) == LYS_UNKNOWN) {
          pLVar7 = ly_errno_location();
          *pLVar7 = LY_EINT;
          plVar9 = (lys_node *)0x0;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                 ,0x1382);
          goto LAB_00163518;
        }
        ly_set_add((ly_set *)set,local_38,1);
        plVar10 = local_38;
      }
      ly_vlog_hide('\x01');
      uVar5 = *(uint *)((long)&set->schema + 4);
      if (uVar5 != 0) {
        uVar12 = 0;
        node = set;
        do {
          pplVar1 = ((ly_set_set *)&set->validity)->s;
          uVar11 = (uint)uVar12;
          plVar10 = pplVar1[uVar12];
          uVar8 = uVar11;
          if (plVar10->nodetype == LYS_CHOICE) {
            if ((lys_node *)list == (lys_node *)0x0) {
              list = (lyd_node *)0x0;
            }
            else {
              uVar8 = uVar11 + 1;
              local_38 = plVar3;
              if ((((uVar8 == uVar5) || (local_38 = pplVar1[uVar8], local_38->nodetype != LYS_CASE))
                  || (uVar5 <= uVar11 + 2)) || (pplVar1[uVar11 + 2]->nodetype != LYS_CHOICE)) {
                local_48 = ((lys_node *)list)->module;
                iVar4 = lyv_multicases((lyd_node *)0x0,local_38,(lyd_node **)&local_48,0,
                                       (lyd_node *)0x0);
                uVar8 = uVar11;
                plVar10 = local_38;
                if (iVar4 != 0) {
                  ly_err_clean(1);
                  goto LAB_0016350f;
                }
              }
            }
          }
          else if (plVar10->nodetype == LYS_CONTAINER) {
            local_38 = plVar10;
            if ((lys_node *)list == (lys_node *)0x0) {
              list = (lyd_node *)0x0;
            }
            else {
              set_00 = lyd_find_xpath(list,plVar10->name);
              if ((set_00 == (ly_set *)0x0) || (1 < set_00->number)) {
                ly_set_free(set_00);
                pLVar7 = ly_errno_location();
                *pLVar7 = LY_EINT;
                plVar9 = (lys_node *)0x0;
                ly_log(LY_LLERR,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                       ,0x1393);
                set = node;
                break;
              }
              if (set_00->number == 0) {
                list = (lyd_node *)0x0;
              }
              else {
                list = (lyd_node *)*(set_00->set).s;
              }
              free((set_00->set).s);
              free(set_00);
              set = node;
            }
            lVar2._0_2_ = local_38[1].flags;
            lVar2._2_1_ = local_38[1].ext_size;
            lVar2._3_1_ = local_38[1].iffeature_size;
            lVar2._4_1_ = local_38[1].padding[0];
            lVar2._5_1_ = local_38[1].padding[1];
            lVar2._6_1_ = local_38[1].padding[2];
            lVar2._7_1_ = local_38[1].padding[3];
            plVar10 = local_38;
            if (lVar2 != 0) {
LAB_0016350f:
              plVar9 = (lys_node *)0x0;
              break;
            }
          }
          local_38 = plVar10;
          uVar12 = (ulong)(uVar8 + 1);
          uVar5 = *(uint *)((long)&set->schema + 4);
        } while (uVar8 + 1 < uVar5);
      }
      ly_vlog_hide('\0');
LAB_00163518:
      ly_set_free((ly_set *)set);
    }
  }
  else {
    pLVar7 = ly_errno_location();
    *pLVar7 = LY_EINT;
    plVar9 = (lys_node *)0x0;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
           ,0x136a);
  }
  return (char *)plVar9;
}

Assistant:

const char *
lyd_get_unique_default(const char* unique_expr, struct lyd_node *list)
{
    const struct lys_node *parent;
    const struct lys_node_leaf *sleaf = NULL;
    struct lys_tpdf *tpdf;
    struct lyd_node *last, *node;
    const char *dflt = NULL;
    struct ly_set *s, *r;
    unsigned int i;

    assert(unique_expr);

    if (resolve_descendant_schema_nodeid(unique_expr, list->schema->child, LYS_LEAF, 1, 1, &parent) || !parent) {
        /* error, but unique expression was checked when the schema was parsed so this should not happened */
        LOGINT;
        return NULL;
    }

    sleaf = (struct lys_node_leaf *)parent;
    if (sleaf->dflt) {
        /* leaf has a default value */
        dflt = sleaf->dflt;
    } else if (!(sleaf->flags & LYS_MAND_TRUE)) {
        /* get the default value from the type */
        for (tpdf = sleaf->type.der; tpdf && !dflt; tpdf = tpdf->type.der) {
            dflt = tpdf->dflt;
        }
    }

    if (!dflt) {
        return NULL;
    }

    /* it has default value, but check if it can appear in the data tree under the list */
    s = ly_set_new();
    for (parent = lys_parent((struct lys_node *)sleaf); parent != list->schema; parent = lys_parent(parent)) {
        if (!(parent->nodetype & (LYS_CONTAINER | LYS_CASE | LYS_CHOICE | LYS_USES))) {
            /* This should be already detected when parsing schema */
            LOGINT;
            ly_set_free(s);
            return NULL;
        }
        ly_set_add(s, (void *)parent, LY_SET_OPT_USEASLIST);
    }
    ly_vlog_hide(1);
    for (i = 0, last = list; i < s->number; i++) {
        parent = s->set.s[i]; /* shortcut */

        switch (parent->nodetype) {
        case LYS_CONTAINER:
            if (last) {
                /* find instance in the data */
                r = lyd_find_xpath(last, parent->name);
                if (!r || r->number > 1) {
                    ly_set_free(r);
                    LOGINT;
                    dflt = NULL;
                    goto end;
                }
                if (r->number) {
                    last = r->set.d[0];
                } else {
                    last = NULL;
                }
                ly_set_free(r);
            }
            if (((struct lys_node_container *)parent)->presence) {
                /* not-instantiated presence container on path */
                dflt = NULL;
                goto end;
            }
            break;
        case LYS_CHOICE :
            /* check presence of another case */
            if (!last) {
                continue;
            }

            /* remember the case to be searched in choice by lyv_multicases() */
            if (i + 1 == s->number) {
                parent = (struct lys_node *)sleaf;
            } else if (s->set.s[i + 1]->nodetype == LYS_CASE && (i + 2 < s->number) &&
                    s->set.s[i + 2]->nodetype == LYS_CHOICE) {
                /* nested choices are covered by lyv_multicases, we just have to pass
                 * the lowest choice */
                i++;
                continue;
            } else {
                parent = s->set.s[i + 1];
            }
            node = last->child;
            if (lyv_multicases(NULL, (struct lys_node *)parent, &node, 0, NULL)) {
                /* another case is present */
                ly_err_clean(1);
                dflt = NULL;
                goto end;
            }
            break;
        default:
            /* LYS_CASE, LYS_USES */
            continue;
        }
    }

end:
    ly_vlog_hide(0);
    ly_set_free(s);
    return dflt;
}